

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O3

void CorUnix::CPalSynchronizationManager::ThreadPrepareForShutdown(void)

{
  if (PAL_InitializeChakraCoreCalled) {
    do {
      poll((pollfd *)0x0,0,-1);
      sched_yield();
    } while( true );
  }
  abort();
}

Assistant:

void CPalSynchronizationManager::ThreadPrepareForShutdown()
    {
        TRACE("The Synchronixation Manager hijacked the current thread "
              "for process shutdown or thread termination\n");
        while (true)
        {
            poll(NULL, 0, INFTIM);
            sched_yield();
        }
        ASSERT("This code should never be executed\n");
    }